

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_CTX_set_alpn_protos(SSL_CTX *ctx,uint8_t *protos,size_t protos_len)

{
  bool bVar1;
  uint uVar2;
  ptrdiff_t _Num;
  Span<const_unsigned_char> in;
  
  if (protos_len == 0) {
    bVar1 = bssl::Array<unsigned_char>::InitUninitialized(&ctx->alpn_client_proto_list,0);
    uVar2 = (uint)!bVar1;
  }
  else {
    in.size_ = protos_len;
    in.data_ = (uchar *)protos_len;
    bVar1 = bssl::ssl_is_valid_alpn_list((bssl *)protos,in);
    if (bVar1) {
      bVar1 = bssl::Array<unsigned_char>::InitUninitialized(&ctx->alpn_client_proto_list,protos_len)
      ;
      uVar2 = 1;
      if (bVar1) {
        memmove((ctx->alpn_client_proto_list).data_,protos,protos_len);
        uVar2 = 0;
      }
    }
    else {
      ERR_put_error(0x10,0,0x13b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x8a5);
      uVar2 = 1;
    }
  }
  return uVar2;
}

Assistant:

int SSL_CTX_set_alpn_protos(SSL_CTX *ctx, const uint8_t *protos,
                            size_t protos_len) {
  // Note this function's return value is backwards.
  auto span = Span(protos, protos_len);
  if (!span.empty() && !ssl_is_valid_alpn_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_ALPN_PROTOCOL_LIST);
    return 1;
  }
  return ctx->alpn_client_proto_list.CopyFrom(span) ? 0 : 1;
}